

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

uint64_t pack_mode1_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  long lVar1;
  long lVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  color_quad_u8 *pcVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint32_t i;
  long lVar16;
  long lVar17;
  color_quad_u8 p;
  byte local_54 [4];
  uint8_t *local_50;
  color_cell_compressor_params *local_40;
  
  lVar16 = 0;
  uVar9 = 0xffffffff;
  uVar10 = 0;
  do {
    uVar13 = (uint)g_bc7_mode_1_optimal_endpoints[b][lVar16].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[g][lVar16].m_error +
             (uint)g_bc7_mode_1_optimal_endpoints[r][lVar16].m_error;
    uVar7 = (uint)lVar16;
    if (uVar13 >= uVar9) {
      uVar7 = uVar10;
    }
    uVar10 = uVar7;
    if (uVar13 < uVar9 && uVar13 == 0) break;
    if (uVar13 < uVar9) {
      uVar9 = uVar13;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 == 1);
  uVar14 = (ulong)uVar10;
  lVar16 = (ulong)r * 8;
  lVar1 = (ulong)g * 8;
  lVar2 = (ulong)b * 8;
  uVar3 = *(uint8_t *)(lVar1 + 0x169182 + uVar14 * 4);
  uVar4 = *(uint8_t *)(lVar2 + 0x169182 + uVar14 * 4);
  (pResults->m_low_endpoint).m_c[0] = *(uint8_t *)(lVar16 + 0x169182 + uVar14 * 4);
  (pResults->m_low_endpoint).m_c[1] = uVar3;
  (pResults->m_low_endpoint).m_c[2] = uVar4;
  lVar17 = 0;
  (pResults->m_low_endpoint).m_c[3] = '\0';
  uVar3 = *(uint8_t *)(lVar1 + 0x169183 + uVar14 * 4);
  uVar4 = *(uint8_t *)(lVar2 + 0x169183 + uVar14 * 4);
  (pResults->m_high_endpoint).m_c[0] = *(uint8_t *)(lVar16 + 0x169183 + uVar14 * 4);
  (pResults->m_high_endpoint).m_c[1] = uVar3;
  (pResults->m_high_endpoint).m_c[2] = uVar4;
  (pResults->m_high_endpoint).m_c[3] = '\0';
  pResults->m_pbits[0] = uVar10;
  pResults->m_pbits[1] = 0;
  local_50 = pSelectors;
  local_40 = pParams;
  memset(pSelectors,2,(ulong)pParams->m_num_pixels);
  uVar9 = pResults->m_pbits[0] * 2;
  do {
    uVar10 = (uint)(pResults->m_low_endpoint).m_c[lVar17] << 2 | uVar9;
    uVar7 = (uint)(pResults->m_high_endpoint).m_c[lVar17] << 2 | uVar9;
    local_54[lVar17] =
         (byte)((uVar10 >> 7 | uVar10) * 0x2e + (uVar7 >> 7 | uVar7) * 0x12 + 0x20 >> 6);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if ((ulong)pParams->m_num_pixels == 0) {
    uVar6 = 0;
  }
  else {
    pcVar5 = pParams->m_pPixels;
    iVar11 = (uint)local_54[2] + ((uint)local_54[2] + (uint)local_54[2] * 8) * 4 +
             (uint)local_54[1] * 0x16e + (uint)local_54[0] * 0x6d;
    uVar14 = 0;
    uVar6 = 0;
    do {
      uVar9 = (uint)pcVar5[uVar14].m_c[0];
      if (pParams->m_perceptual == '\0') {
        iVar12 = local_54[0] - uVar9;
        iVar15 = (uint)local_54[1] - (uint)pcVar5[uVar14].m_c[1];
        iVar8 = (uint)local_54[2] - (uint)pcVar5[uVar14].m_c[2];
      }
      else {
        iVar8 = (uint)pcVar5[uVar14].m_c[2] * 0x25 +
                (uint)pcVar5[uVar14].m_c[1] * 0x16e + uVar9 * 0x6d;
        iVar12 = iVar11 - iVar8 >> 8;
        iVar15 = (int)(((local_54[0] - uVar9) * 0x200 - iVar11) + iVar8) >> 8;
        iVar8 = (int)(((uint)local_54[2] * 0x200 - ((uint)pcVar5[uVar14].m_c[2] * 0x200 + iVar11)) +
                     iVar8) >> 8;
      }
      uVar6 = uVar6 + (iVar8 * iVar8 * pParams->m_weights[2] +
                      iVar15 * iVar15 * pParams->m_weights[1] +
                      iVar12 * iVar12 * pParams->m_weights[0]);
      uVar14 = uVar14 + 1;
    } while (pParams->m_num_pixels != uVar14);
  }
  pResults->m_best_overall_err = uVar6;
  return uVar6;
}

Assistant:

static uint64_t pack_mode1_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 2; p++)
	{
		uint32_t err = g_bc7_mode_1_optimal_endpoints[r][p].m_error + g_bc7_mode_1_optimal_endpoints[g][p].m_error + g_bc7_mode_1_optimal_endpoints[b][p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	const endpoint_err *pEr = &g_bc7_mode_1_optimal_endpoints[r][best_p];
	const endpoint_err *pEg = &g_bc7_mode_1_optimal_endpoints[g][best_p];
	const endpoint_err *pEb = &g_bc7_mode_1_optimal_endpoints[b][best_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = best_p;
	pResults->m_pbits[1] = 0;

	memset(pSelectors, BC7ENC_MODE_1_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = ((pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		low |= (low >> 7);

		uint32_t high = ((pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		high |= (high >> 7);

		p.m_c[i] = (uint8_t)((low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}